

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_pass.cpp
# Opt level: O0

Instruction * __thiscall
spvtools::opt::MemPass::GetPtr(MemPass *this,Instruction *ip,uint32_t *varId)

{
  Op OVar1;
  uint32_t ptrId_00;
  Instruction *pIVar2;
  bool local_25;
  uint32_t ptrId;
  uint32_t *varId_local;
  Instruction *ip_local;
  MemPass *this_local;
  
  OVar1 = Instruction::opcode(ip);
  local_25 = true;
  if (OVar1 != OpStore) {
    OVar1 = Instruction::opcode(ip);
    local_25 = true;
    if (OVar1 != OpLoad) {
      OVar1 = Instruction::opcode(ip);
      local_25 = true;
      if (OVar1 != OpImageTexelPointer) {
        local_25 = Instruction::IsAtomicWithLoad(ip);
      }
    }
  }
  if (local_25 == false) {
    __assert_fail("ip->opcode() == spv::Op::OpStore || ip->opcode() == spv::Op::OpLoad || ip->opcode() == spv::Op::OpImageTexelPointer || ip->IsAtomicWithLoad()"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/mem_pass.cpp"
                  ,0x83,"Instruction *spvtools::opt::MemPass::GetPtr(Instruction *, uint32_t *)");
  }
  ptrId_00 = Instruction::GetSingleWordInOperand(ip,0);
  pIVar2 = GetPtr(this,ptrId_00,varId);
  return pIVar2;
}

Assistant:

Instruction* MemPass::GetPtr(Instruction* ip, uint32_t* varId) {
  assert(ip->opcode() == spv::Op::OpStore || ip->opcode() == spv::Op::OpLoad ||
         ip->opcode() == spv::Op::OpImageTexelPointer ||
         ip->IsAtomicWithLoad());

  // All of these opcode place the pointer in position 0.
  const uint32_t ptrId = ip->GetSingleWordInOperand(0);
  return GetPtr(ptrId, varId);
}